

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry_attribute.h
# Opt level: O1

bool __thiscall
draco::GeometryAttribute::ConvertTypedValue<int,long>
          (GeometryAttribute *this,AttributeValueIndex att_id,uint8_t out_num_components,
          long *out_value)

{
  int *piVar1;
  byte bVar2;
  int *piVar3;
  uint uVar4;
  ulong uVar5;
  bool bVar6;
  
  uVar4 = *(uint *)&this->num_components_;
  bVar2 = out_num_components;
  if ((byte)uVar4 < out_num_components) {
    bVar2 = (byte)uVar4;
  }
  bVar6 = bVar2 == 0;
  if (bVar6) {
LAB_0014c38b:
    if ((byte)uVar4 < out_num_components) {
      memset(out_value + (uVar4 & 0xff),0,
             (ulong)((uint)out_num_components + ~(uVar4 & 0xff)) * 8 + 8);
    }
  }
  else {
    piVar3 = (int *)((this->buffer_->data_).
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start +
                    this->byte_offset_ + (ulong)att_id.value_ * this->byte_stride_);
    piVar1 = (int *)(this->buffer_->data_).
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_finish;
    if (piVar3 < piVar1) {
      uVar5 = 1;
      do {
        out_value[uVar5 - 1] = (long)*piVar3;
        uVar4 = *(uint *)&this->num_components_;
        bVar2 = (byte)uVar4;
        if (out_num_components <= (byte)uVar4) {
          bVar2 = out_num_components;
        }
        bVar6 = bVar2 <= uVar5;
        if (bVar6) goto LAB_0014c38b;
        piVar3 = piVar3 + 1;
        uVar5 = uVar5 + 1;
      } while (piVar3 < piVar1);
    }
  }
  return bVar6;
}

Assistant:

bool ConvertTypedValue(AttributeValueIndex att_id, uint8_t out_num_components,
                         OutT *out_value) const {
    const uint8_t *src_address = GetAddress(att_id);

    // Convert all components available in both the original and output formats.
    for (int i = 0; i < std::min(num_components_, out_num_components); ++i) {
      if (!IsAddressValid(src_address)) {
        return false;
      }
      const T in_value = *reinterpret_cast<const T *>(src_address);
      if (!ConvertComponentValue<T, OutT>(in_value, normalized_,
                                          out_value + i)) {
        return false;
      }
      src_address += sizeof(T);
    }
    // Fill empty data for unused output components if needed.
    for (int i = num_components_; i < out_num_components; ++i) {
      out_value[i] = static_cast<OutT>(0);
    }
    return true;
  }